

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O1

Element * __thiscall
Rml::ElementDocument::FindNextNavigationElement
          (ElementDocument *this,Element *current_element,NavigationSearchDirection direction,
          Property *property)

{
  element_type *peVar1;
  Vector2f VVar2;
  Element *pEVar3;
  Box *this_00;
  ElementDocument *this_01;
  ComputedValues *pCVar4;
  char *pcVar5;
  char *pcVar6;
  ElementDocument *element;
  ulong uVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  SearchNavigationResult best_result;
  BoundingBox bounding_box;
  String local_78;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined1 local_38 [24];
  
  if (property->unit == KEYWORD) {
    local_58._0_4_ = 0.0;
    Variant::GetInto<int,_0>(&property->value,(int *)local_58);
    if (local_58[0] != '\0') {
      if ((local_58._0_4_ & 0xff) == 3) {
        if (direction < Left) goto LAB_00229033;
      }
      else if (((local_58._0_4_ & 0xff) != 2) || ((direction & ~Down) == Left)) {
LAB_00229033:
        if ((ElementDocument *)current_element != this) {
          VVar2 = Element::GetAbsoluteOffset(current_element,Border);
          local_38._8_4_ = extraout_XMM0_Dc;
          local_38._0_4_ = VVar2.x;
          local_38._4_4_ = VVar2.y;
          local_38._12_4_ = extraout_XMM0_Dd;
          this_00 = Element::GetBox(current_element);
          VVar2 = Box::GetSize(this_00,Border);
          fStack_50 = VVar2.x + (float)local_38._0_4_;
          fStack_4c = VVar2.y + (float)local_38._4_4_;
          local_58._0_4_ = local_38._0_4_;
          local_58._4_4_ = local_38._4_4_;
          this_01 = (ElementDocument *)Element::GetParentNode(current_element);
          while ((element = this, this_01 != (ElementDocument *)0x0 &&
                 (pCVar4 = Element::GetComputedValues(&this_01->super_Element), element = this_01,
                 ((*(uint *)&pCVar4->common >> 0xc | *(uint *)&pCVar4->common >> 10) & 3) == 0))) {
            this_01 = (ElementDocument *)Element::GetParentNode(&this_01->super_Element);
          }
          local_78._M_dataplus._M_p = (pointer)0x0;
          local_78._M_string_length._0_4_ = 0x7fffffff;
          anon_unknown_0::SearchNavigationTarget
                    ((SearchNavigationResult *)&local_78,&element->super_Element,direction,
                     (BoundingBox *)local_58,current_element);
          return (Element *)local_78._M_dataplus._M_p;
        }
        pEVar3 = FindNextTabElement(this,&this->super_Element,(direction & ~Left) == Down);
        return pEVar3;
      }
    }
  }
  else if (property->unit == STRING) {
    peVar1 = (property->source).
             super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    Property::Get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
               property);
    pcVar6 = (char *)CONCAT44(local_58._4_4_,local_58._0_4_);
    if (*pcVar6 == '#') {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_78,pcVar6 + 1,pcVar6 + CONCAT44(fStack_4c,fStack_50));
      pEVar3 = Element::GetElementById(&this->super_Element,&local_78);
      if (pEVar3 == (Element *)0x0) {
        if (peVar1 == (element_type *)0x0) {
          pcVar6 = "";
          uVar7 = 0xffffffff;
        }
        else {
          pcVar6 = (peVar1->path)._M_dataplus._M_p;
          uVar7 = (ulong)(uint)peVar1->line_number;
        }
        Log::Message(LT_WARNING,
                     "Trying to navigate to element with id \'%s\', but could not find element. Declared at %s:%d"
                     ,local_78._M_dataplus._M_p,pcVar6,uVar7);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (peVar1 == (element_type *)0x0) {
        pcVar5 = "";
        uVar7 = 0xffffffff;
      }
      else {
        pcVar5 = (peVar1->path)._M_dataplus._M_p;
        uVar7 = (ulong)(uint)peVar1->line_number;
      }
      pEVar3 = (Element *)0x0;
      Log::Message(LT_WARNING,
                   "Invalid navigation value \'%s\': Expected a keyword or a string with an element id prefixed with \'#\'. Declared at %s:%d"
                   ,pcVar6,pcVar5,uVar7);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_58._4_4_,local_58._0_4_) == &local_48) {
      return pEVar3;
    }
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_58._4_4_,local_58._0_4_),local_48._M_allocated_capacity + 1);
    return pEVar3;
  }
  return (Element *)0x0;
}

Assistant:

Element* ElementDocument::FindNextNavigationElement(Element* current_element, NavigationSearchDirection direction, const Property& property)
{
	switch (property.unit)
	{
	case Unit::STRING:
	{
		const PropertySource* source = property.source.get();
		const String value = property.Get<String>();
		if (value[0] != '#')
		{
			Log::Message(Log::LT_WARNING,
				"Invalid navigation value '%s': Expected a keyword or a string with an element id prefixed with '#'. Declared at %s:%d",
				value.c_str(), source ? source->path.c_str() : "", source ? source->line_number : -1);
			return nullptr;
		}

		const String id = String(value.begin() + 1, value.end());
		Element* result = GetElementById(id);
		if (!result)
		{
			Log::Message(Log::LT_WARNING, "Trying to navigate to element with id '%s', but could not find element. Declared at %s:%d", id.c_str(),
				source ? source->path.c_str() : "", source ? source->line_number : -1);
		}
		return result;
	}
	break;
	case Unit::KEYWORD:
	{
		const bool direction_is_horizontal = (direction == NavigationSearchDirection::Left || direction == NavigationSearchDirection::Right);
		const bool direction_is_vertical = (direction == NavigationSearchDirection::Up || direction == NavigationSearchDirection::Down);
		switch (static_cast<Style::Nav>(property.value.Get<int>()))
		{
		case Style::Nav::None: return nullptr;
		case Style::Nav::Auto: break;
		case Style::Nav::Horizontal:
			if (!direction_is_horizontal)
				return nullptr;
			break;
		case Style::Nav::Vertical:
			if (!direction_is_vertical)
				return nullptr;
			break;
		}
	}
	break;
	default: return nullptr;
	}

	if (current_element == this)
	{
		const bool direction_is_forward = (direction == NavigationSearchDirection::Down || direction == NavigationSearchDirection::Right);
		return FindNextTabElement(this, direction_is_forward);
	}

	const Vector2f position = current_element->GetAbsoluteOffset(BoxArea::Border);
	const BoundingBox bounding_box = {position, position + current_element->GetBox().GetSize(BoxArea::Border)};

	auto GetNearestScrollContainer = [this](Element* element) -> Element* {
		for (element = element->GetParentNode(); element; element = element->GetParentNode())
		{
			if (IsScrollContainer(element))
				return element;
		}
		return this;
	};
	Element* start_element = GetNearestScrollContainer(current_element);

	SearchNavigationResult best_result;
	SearchNavigationTarget(best_result, start_element, direction, bounding_box, current_element);
	return best_result.element;
}